

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O1

RTCDevice rtcGetSceneDevice(RTCScene hscene)

{
  RTCDevice pRVar1;
  undefined8 *puVar2;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  if (hscene != (RTCScene)0x0) {
    pRVar1 = (RTCDevice)(**(code **)(**(long **)(hscene + 0x188) + 0x10))();
    return pRVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"invalid argument","");
  *puVar2 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar2 + 1) = 2;
  puVar2[2] = puVar2 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_50,local_50 + local_48);
  __cxa_throw(puVar2,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API RTCDevice rtcGetSceneDevice(RTCScene hscene)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcGetSceneDevice);
    RTC_VERIFY_HANDLE(hscene);
    return (RTCDevice)scene->device->refInc(); // user will own one additional device reference
    RTC_CATCH_END2(scene);
    return (RTCDevice)nullptr;
  }